

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexHalf.cpp
# Opt level: O3

uint16_t Ptex::v2_4::PtexHalf::fromFloat_except(uint32_t i)

{
  ushort uVar1;
  uint uVar2;
  
  uVar1 = (ushort)(i >> 0x10) & 0x8000;
  uVar2 = i >> 0xd & 0x3fc00;
  if (uVar2 < 0x1c001) {
    return uVar1 | (ushort)(int)(ABS((float)i) * 16777216.0 + 0.5);
  }
  if (uVar2 == 0x3fc00) {
    uVar1 = uVar1 | (ushort)(i >> 0xd) & 0x3ff;
  }
  return uVar1 | 0x7c00;
}

Assistant:

uint16_t PtexHalf::fromFloat_except(uint32_t i)
{
    uint32_t s = ((i>>16) & 0x8000);
    int32_t e = ((i>>13) & 0x3fc00) - 0x1c000;

    if (e <= 0) {
        // denormalized
        union { uint32_t i; float f; } u;
        u.i = i;
        return (uint16_t)(s|int(fabs(u.f)*1.6777216e7 + .5));
    }

    if (e == 0x23c00)
        // inf/nan, preserve msb bits of m for nan code
        return (uint16_t)(s|0x7c00|((i&0x7fffff)>>13));
    else
        // overflow - convert to inf
        return (uint16_t)(s|0x7c00);
}